

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.cpp
# Opt level: O0

void __thiscall
qclab::qgates::RotationX<std::complex<double>_>::apply
          (RotationX<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  complex<double> *pcVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector_00;
  double __x;
  double __x_00;
  double sin;
  undefined1 local_48 [8];
  anon_class_32_3_ec8a4a28 f;
  int qubit;
  int offset_local;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  RotationX<std::complex<double>_> *this_local;
  
  vector_00 = vector;
  f.s._M_value._12_4_ = offset;
  iVar1 = (*(this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  f.s._M_value._8_4_ = iVar1 + f.s._M_value._12_4_;
  __x_00 = QRotationGate1<std::complex<double>_>::cos
                     (&this->super_QRotationGate1<std::complex<double>_>,__x);
  sin = QRotationGate1<std::complex<double>_>::sin
                  (&this->super_QRotationGate1<std::complex<double>_>,__x_00);
  pcVar2 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::data(vector);
  lambda_RotationX<std::complex<double>,double>
            ((anon_class_32_3_ec8a4a28 *)local_48,(qgates *)(ulong)(uint)(int)(char)op,(Op)pcVar2,
             __x_00,sin,(complex<double> *)vector_00);
  apply2<qclab::qgates::lambda_RotationX<std::complex<double>,double>(qclab::Op,double,double,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,f.s._M_value._8_4_,(anon_class_32_3_ec8a4a28 *)local_48);
  return;
}

Assistant:

void RotationX< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationX( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }